

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uspoof.cpp
# Opt level: O3

void uspoof_setChecks_63(USpoofChecker *sc,int32_t checks,UErrorCode *status)

{
  SpoofImpl *pSVar1;
  
  pSVar1 = icu_63::SpoofImpl::validateThis(sc,status);
  if (pSVar1 != (SpoofImpl *)0x0) {
    if ((checks & 0xbfff0000U) == 0) {
      pSVar1->fChecks = checks;
    }
    else {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uspoof_setChecks(USpoofChecker *sc, int32_t checks, UErrorCode *status) {
    SpoofImpl *This = SpoofImpl::validateThis(sc, *status);
    if (This == NULL) {
        return;
    }

    // Verify that the requested checks are all ones (bits) that 
    //   are acceptable, known values.
    if (checks & ~(USPOOF_ALL_CHECKS | USPOOF_AUX_INFO)) {
        *status = U_ILLEGAL_ARGUMENT_ERROR; 
        return;
    }

    This->fChecks = checks;
}